

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCTest *pcVar1;
  bool bVar2;
  __type _Var3;
  const_reference s;
  ostream *poVar4;
  const_reference pvVar5;
  char *pcVar6;
  reference pbVar7;
  bool collapse;
  string local_9b0 [32];
  undefined1 local_990 [8];
  ostringstream cmCTestLog_msg_3;
  string local_818;
  undefined1 local_7f8 [8];
  cmCTestTestProperties test;
  ostringstream local_520 [8];
  ostringstream cmCTestLog_msg_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  byte local_391;
  iterator iStack_390;
  bool found_1;
  iterator it_1;
  ostringstream local_368 [8];
  ostringstream cmCTestLog_msg_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  byte local_1d9;
  iterator iStack_1d8;
  bool found;
  iterator it;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  string *testname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestTestHandler *this_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,0);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = std::operator<<((ostream *)local_1a0,"Add test: ");
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,0);
  poVar4 = std::operator<<(poVar4,(string *)pvVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x936,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  if ((((this->UseExcludeRegExpFlag & 1U) == 0) || ((this->UseExcludeRegExpFirst & 1U) == 0)) ||
     (bVar2 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,s), !bVar2)) {
    if ((this->MemCheck & 1U) == 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&stack0xfffffffffffffc70);
      local_391 = 0;
      local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(&this->CustomTestsIgnore);
      iStack_390 = (iterator)local_3a0;
      while( true ) {
        local_3a8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->CustomTestsIgnore);
        bVar2 = __gnu_cxx::operator!=(&stack0xfffffffffffffc70,&local_3a8);
        if (!bVar2) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xfffffffffffffc70);
        _Var3 = std::operator==(pbVar7,s);
        if (_Var3) {
          local_391 = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&stack0xfffffffffffffc70);
      }
      if ((local_391 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_520);
        poVar4 = std::operator<<((ostream *)local_520,"Ignore test: ");
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xfffffffffffffc70);
        poVar4 = std::operator<<(poVar4,(string *)pbVar7);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x957,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string
                  ((string *)
                   &test.Backtrace.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::ostringstream::~ostringstream(local_520);
        return true;
      }
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&stack0xfffffffffffffe28);
      local_1d9 = 0;
      local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(&this->CustomTestsIgnore);
      iStack_1d8 = (iterator)local_1e8;
      while( true ) {
        local_1f0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->CustomTestsIgnore);
        bVar2 = __gnu_cxx::operator!=(&stack0xfffffffffffffe28,&local_1f0);
        if (!bVar2) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xfffffffffffffe28);
        _Var3 = std::operator==(pbVar7,s);
        if (_Var3) {
          local_1d9 = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&stack0xfffffffffffffe28);
      }
      if ((local_1d9 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_368);
        poVar4 = std::operator<<((ostream *)local_368,"Ignore memcheck: ");
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xfffffffffffffe28);
        poVar4 = std::operator<<(poVar4,(string *)pbVar7);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x948,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&it_1);
        std::__cxx11::ostringstream::~ostringstream(local_368);
        return true;
      }
    }
    cmCTestTestProperties::cmCTestTestProperties((cmCTestTestProperties *)local_7f8);
    std::__cxx11::string::operator=((string *)local_7f8,(string *)s);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&test.Directory.field_2 + 8),args);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_818,(SystemTools *)0x1,collapse);
    std::__cxx11::string::operator=
              ((string *)(test.Name.field_2._M_local_buf + 8),(string *)&local_818);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_990);
    poVar4 = std::operator<<((ostream *)local_990,"Set test directory: ");
    poVar4 = std::operator<<(poVar4,(string *)(test.Name.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x962,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_9b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_990);
    test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
    test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = 0;
    test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ = 0;
    test.Cost._0_1_ = 0;
    test._312_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    test.Timeout.__r._0_1_ = 0;
    test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    test.AlternateTimeout.__r._4_4_ = 1;
    test.Index._0_1_ = 0;
    test.Affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
    test.IsInBasedOnREOptions = false;
    test.WillFail = false;
    test.Disabled = false;
    test._307_1_ = 0;
    if (((this->UseIncludeRegExpFlag & 1U) == 0) ||
       (bVar2 = cmsys::RegularExpression::find(&this->IncludeTestsRegularExpression,s), bVar2)) {
      if (((this->UseExcludeRegExpFlag & 1U) != 0) &&
         (((this->UseExcludeRegExpFirst & 1U) == 0 &&
          (bVar2 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,s), bVar2))))
      {
        test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
      }
    }
    else {
      test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ::push_back(&this->TestList,(value_type *)local_7f8);
    cmCTestTestProperties::~cmCTestTestProperties((cmCTestTestProperties *)local_7f8);
  }
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
                     this->Quiet);

  if (this->UseExcludeRegExpFlag && this->UseExcludeRegExpFirst &&
      this->ExcludeTestsRegularExpression.find(testname)) {
    return true;
  }
  if (this->MemCheck) {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
    }
  } else {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore test: " << *it << std::endl, this->Quiet);
      return true;
    }
  }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Set test directory: " << test.Directory << std::endl,
                     this->Quiet);

  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.Disabled = false;
  test.RunSerial = false;
  test.Timeout = cmDuration::zero();
  test.ExplicitTimeout = false;
  test.Cost = 0;
  test.Processors = 1;
  test.WantAffinity = false;
  test.SkipReturnCode = -1;
  test.PreviousRuns = 0;
  if (this->UseIncludeRegExpFlag &&
      !this->IncludeTestsRegularExpression.find(testname)) {
    test.IsInBasedOnREOptions = false;
  } else if (this->UseExcludeRegExpFlag && !this->UseExcludeRegExpFirst &&
             this->ExcludeTestsRegularExpression.find(testname)) {
    test.IsInBasedOnREOptions = false;
  }
  this->TestList.push_back(test);
  return true;
}